

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::Array<kj::ArrayPtr<unsigned_char_const>>::attach<kj::Vector<kj::Array<unsigned_char>>>
          (Array<kj::ArrayPtr<const_unsigned_char>_> *__return_storage_ptr__,void *this,
          Vector<kj::Array<unsigned_char>_> *attachments)

{
  size_t size;
  ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  *this_00;
  Array<kj::ArrayPtr<const_unsigned_char>_> *values;
  Vector<kj::Array<unsigned_char>_> *values_1;
  ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
  *bundle;
  size_t sizeCopy;
  ArrayPtr<const_unsigned_char> *ptrCopy;
  Vector<kj::Array<unsigned_char>_> *attachments_local;
  Array<kj::ArrayPtr<const_unsigned_char>_> *this_local;
  
  sizeCopy = *this;
  size = *(size_t *)((long)this + 8);
  if (sizeCopy != 0) {
    if (sizeCopy == 0) {
      sizeCopy = 1;
    }
    this_00 = (ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
               *)operator_new(0x40);
    values = mv<kj::Array<kj::ArrayPtr<unsigned_char_const>>>
                       ((Array<kj::ArrayPtr<const_unsigned_char>_> *)this);
    values_1 = fwd<kj::Vector<kj::Array<unsigned_char>>>(attachments);
    kj::_::
    ArrayDisposableOwnedBundle<kj::Array<kj::ArrayPtr<const_unsigned_char>_>,_kj::Vector<kj::Array<unsigned_char>_>_>
    ::ArrayDisposableOwnedBundle(this_00,values,values_1);
    Array<kj::ArrayPtr<const_unsigned_char>_>::Array
              (__return_storage_ptr__,(ArrayPtr<const_unsigned_char> *)sizeCopy,size,
               (ArrayDisposer *)this_00);
    return __return_storage_ptr__;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array.h"
             ,0x37d,"ptrCopy != nullptr","\"cannot attach to null pointer\"",
             "cannot attach to null pointer");
}

Assistant:

Array<T> Array<T>::attach(Attachments&&... attachments) {
  T* ptrCopy = ptr;
  auto sizeCopy = size_;

  KJ_IREQUIRE(ptrCopy != nullptr, "cannot attach to null pointer");

  // HACK: If someone accidentally calls .attach() on a null pointer in opt mode, try our best to
  //   accomplish reasonable behavior: We turn the pointer non-null but still invalid, so that the
  //   disposer will still be called when the pointer goes out of scope.
  if (ptrCopy == nullptr) ptrCopy = reinterpret_cast<T*>(1);

  auto bundle = new _::ArrayDisposableOwnedBundle<Array<T>, Attachments...>(
      kj::mv(*this), kj::fwd<Attachments>(attachments)...);
  return Array<T>(ptrCopy, sizeCopy, *bundle);
}